

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O3

LY_ERR lys_precompile_own_deviation(lysc_ctx *ctx,lysp_deviation *dev_p,lysp_module *pmod)

{
  void *pvVar1;
  lyd_node_inner *plVar2;
  ly_ht *plVar3;
  ly_bool lVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  lyd_node *plVar7;
  long *plVar8;
  lysc_node *plVar9;
  long lVar10;
  ulong uVar11;
  lysc_nodeid *nodeid1;
  lysc_nodeid *local_38;
  
  local_38 = (lysc_nodeid *)0x0;
  LVar5 = lys_precompile_nodeid(ctx->ctx,dev_p->nodeid,&local_38);
  nodeid1 = local_38;
  if (LVar5 != LY_SUCCESS) goto LAB_001512c2;
  plVar6 = lys_schema_node_get_module(ctx->ctx,*local_38->prefix,pmod);
  if (plVar6 == (lys_module *)0x0) {
    LVar5 = LY_EINT;
    ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
           ,0x8eb);
    goto LAB_001512c2;
  }
  LVar5 = LY_SUCCESS;
  if (plVar6 != ctx->cur_mod) goto LAB_001512c2;
  if ((ctx->devs).count != 0) {
    uVar11 = 0;
    do {
      plVar7 = (ctx->devs).field_2.dnodes[uVar11];
      lVar4 = lys_abs_schema_nodeid_match
                        (ctx->ctx,nodeid1,pmod,*(lysc_nodeid **)plVar7,
                         *(lysp_module **)&plVar7->parent->field_0);
      if (lVar4 != '\0') {
        plVar7 = (ctx->devs).field_2.dnodes[uVar11];
        if (plVar7 != (lyd_node *)0x0) goto LAB_001513b0;
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ctx->devs).count);
  }
  plVar7 = (lyd_node *)calloc(1,0x20);
  if (plVar7 != (lyd_node *)0x0) {
    LVar5 = ly_set_add(&ctx->devs,plVar7,'\x01',(uint32_t *)0x0);
    if (LVar5 != LY_SUCCESS) goto LAB_001512c2;
    *(lysc_nodeid **)plVar7 = nodeid1;
    nodeid1 = (lysc_nodeid *)0x0;
LAB_001513b0:
    plVar9 = plVar7->schema;
    if (plVar9 == (lysc_node *)0x0) {
      plVar8 = (long *)malloc(0x10);
      if (plVar8 == (long *)0x0) goto LAB_00151475;
      *plVar8 = 1;
      lVar10 = 1;
LAB_001513ff:
      plVar7->schema = (lysc_node *)(plVar8 + 1);
      plVar8[lVar10] = (long)dev_p;
      plVar2 = plVar7->parent;
      if (plVar2 == (lyd_node_inner *)0x0) {
        plVar8 = (long *)malloc(0x10);
        if (plVar8 == (long *)0x0) goto LAB_00151475;
        *plVar8 = 1;
        lVar10 = 1;
      }
      else {
        plVar3 = plVar2[-1].children_ht;
        plVar2[-1].children_ht = (ly_ht *)((long)&plVar3->used + 1);
        plVar8 = (long *)realloc(&plVar2[-1].children_ht,(long)plVar3 * 8 + 0x10);
        if (plVar8 == (long *)0x0) {
          plVar9 = (lysc_node *)plVar7->parent;
          goto LAB_00151471;
        }
        lVar10 = *plVar8;
      }
      plVar7->parent = (lyd_node_inner *)(plVar8 + 1);
      plVar8[lVar10] = (long)pmod;
      LVar5 = LY_SUCCESS;
      goto LAB_001512c2;
    }
    pvVar1 = plVar9[-1].priv;
    plVar9[-1].priv = (void *)((long)pvVar1 + 1);
    plVar8 = (long *)realloc(&plVar9[-1].priv,(long)pvVar1 * 8 + 0x10);
    if (plVar8 != (long *)0x0) {
      lVar10 = *plVar8;
      goto LAB_001513ff;
    }
    plVar9 = plVar7->schema;
LAB_00151471:
    plVar9[-1].priv = (void *)((long)plVar9[-1].priv + -1);
  }
LAB_00151475:
  LVar5 = LY_EMEM;
  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_precompile_own_deviation"
        );
LAB_001512c2:
  lysc_nodeid_free(ctx->ctx,nodeid1);
  return LVar5;
}

Assistant:

static LY_ERR
lys_precompile_own_deviation(struct lysc_ctx *ctx, struct lysp_deviation *dev_p, const struct lysp_module *pmod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_deviation *dev = NULL;
    struct lysc_nodeid *nodeid = NULL;
    struct lysp_deviation **new_dev;
    const struct lys_module *mod;
    const struct lysp_module **new_dev_pmod;
    uint32_t i;

    /* parse its target, it was already parsed and fully checked (except for the existence of the nodes) */
    ret = lys_precompile_nodeid(ctx->ctx, dev_p->nodeid, &nodeid);
    LY_CHECK_GOTO(ret, cleanup);

    mod = lys_schema_node_get_module(ctx->ctx, nodeid->prefix[0], pmod);
    LY_CHECK_ERR_GOTO(!mod, LOGINT(ctx->ctx); ret = LY_EINT, cleanup);
    if (mod != ctx->cur_mod) {
        /* deviation for another module, ignore */
        goto cleanup;
    }

    /* try to find the node in already compiled deviations */
    for (i = 0; i < ctx->devs.count; ++i) {
        if (lys_abs_schema_nodeid_match(ctx->ctx, nodeid, pmod, ((struct lysc_deviation *)ctx->devs.objs[i])->nodeid,
                ((struct lysc_deviation *)ctx->devs.objs[i])->dev_pmods[0])) {
            dev = ctx->devs.objs[i];
            break;
        }
    }

    if (!dev) {
        /* allocate new compiled deviation */
        dev = calloc(1, sizeof *dev);
        LY_CHECK_ERR_GOTO(!dev, LOGMEM(ctx->ctx); ret = LY_EMEM, cleanup);
        LY_CHECK_GOTO(ret = ly_set_add(&ctx->devs, dev, 1, NULL), cleanup);

        dev->nodeid = nodeid;
        nodeid = NULL;
    }

    /* add new parsed deviation structure */
    LY_ARRAY_NEW_GOTO(ctx->ctx, dev->devs, new_dev, ret, cleanup);
    *new_dev = dev_p;
    LY_ARRAY_NEW_GOTO(ctx->ctx, dev->dev_pmods, new_dev_pmod, ret, cleanup);
    *new_dev_pmod = pmod;

cleanup:
    lysc_nodeid_free(ctx->ctx, nodeid);
    return ret;
}